

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal.h
# Opt level: O0

uint * calculate_syndrome(uint *c1,uint c_len,uint t,uint *new_len)

{
  uint len_00;
  uint b;
  uint uVar1;
  uint *puVar2;
  uint local_38;
  uint local_34;
  uint j;
  uint i;
  uint *S;
  uint len;
  uint *new_len_local;
  uint t_local;
  uint c_len_local;
  uint *c1_local;
  
  len_00 = t << 1;
  if (new_len != (uint *)0x0) {
    *new_len = len_00;
  }
  puVar2 = vector_new(len_00);
  for (local_34 = 1; local_34 <= len_00; local_34 = local_34 + 1) {
    puVar2[local_34 - 1] = 0;
    for (local_38 = 0; local_38 < c_len; local_38 = local_38 + 1) {
      uVar1 = puVar2[local_34 - 1];
      b = gf_mul(c1[local_38],alpha_of[local_34 * local_38 & 0xff]);
      uVar1 = gf_sum(uVar1,b);
      puVar2[local_34 - 1] = uVar1;
    }
  }
  return puVar2;
}

Assistant:

uint32_t *calculate_syndrome(uint32_t *c1, uint32_t c_len, uint32_t t, uint32_t *new_len)
{
    uint32_t len = 2 * t;
    if (new_len != NULL)
        *new_len = len;

    uint32_t *S = vector_new(len);
    for (uint32_t i = 1; i <= len; i++)
    {
        S[i - 1] = 0;
        for (uint32_t j = 0; j < c_len; j++)
            S[i - 1] = gf_sum(S[i - 1], gf_mul(c1[j], alpha_of[i * j % GFsize]));
    }

    return S;
}